

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O2

uint32_t mpr_calculate_minimal_d_z_y(nhdp_domain *domain,neighbor_graph *graph,addr_node *y)

{
  avl_node **ppaVar1;
  oonf_log_source source;
  uint32_t uVar2;
  char *pcVar3;
  char *pcVar4;
  neighbor_graph *pnVar5;
  uint uVar6;
  ulong uVar7;
  netaddr *src;
  netaddr_str nbuf1;
  netaddr_str nbuf2;
  
  uVar7 = (ulong)y->min_d_z_y;
  if (y->min_d_z_y == 0) {
    uVar7 = 0xffffffffffffffff;
    src = (netaddr *)0x0;
    pnVar5 = graph;
    while( true ) {
      source = LOG_MPR;
      pnVar5 = (neighbor_graph *)(pnVar5->set_n1).list_head.next;
      uVar6 = (uint)uVar7;
      if ((pnVar5->set_n1).list_head.prev == (graph->set_n1).list_head.prev) break;
      ppaVar1 = &pnVar5[-1].set_mpr_candidates.root;
      uVar2 = (*graph->methods->calculate_d_x_y)(domain,graph,(n1_node *)ppaVar1,y);
      if (uVar2 < uVar6) {
        src = (netaddr *)ppaVar1;
      }
      uVar7 = uVar7 & 0xffffffff;
      if (uVar2 < uVar6) {
        uVar7 = (ulong)uVar2;
      }
    }
    if (src == (netaddr *)0x0) {
      if ((log_global_mask[LOG_MPR] & 1) != 0) {
        pcVar3 = netaddr_to_prefixstring(&nbuf1,&y->addr,false);
        oonf_log(LOG_SEVERITY_DEBUG,source,"src/nhdp/mpr/neighbor-graph.c",0xce,(void *)0x0,0,
                 "minimal d_z_y(%s) = infinite",pcVar3);
      }
    }
    else if ((log_global_mask[LOG_MPR] & 1) != 0) {
      pcVar3 = netaddr_to_prefixstring(&nbuf1,&y->addr,false);
      pcVar4 = netaddr_to_prefixstring(&nbuf2,src,false);
      oonf_log(LOG_SEVERITY_DEBUG,source,"src/nhdp/mpr/neighbor-graph.c",0xcb,(void *)0x0,0,
               "minimal d_z_y(%s) = %s (cost %u)",pcVar3,pcVar4,uVar7);
    }
    y->min_d_z_y = uVar6;
  }
  return (uint32_t)uVar7;
}

Assistant:

uint32_t
mpr_calculate_minimal_d_z_y(const struct nhdp_domain *domain, struct neighbor_graph *graph, struct addr_node *y) {
  struct n1_node *z_node;
  uint32_t d_z_y, min_d_z_y;
#ifdef OONF_LOG_DEBUG_INFO
  struct n1_node *remember;
  struct netaddr_str nbuf1, nbuf2;
#endif
  if (y->min_d_z_y) {
    return y->min_d_z_y;
  }

  min_d_z_y = RFC7181_METRIC_INFINITE_PATH;
#ifdef OONF_LOG_DEBUG_INFO
  remember = NULL;
#endif
  avl_for_each_element(&graph->set_n1, z_node, _avl_node) {
    d_z_y = graph->methods->calculate_d_x_y(domain, graph, z_node, y);
    if (d_z_y < min_d_z_y) {
      min_d_z_y = d_z_y;
#ifdef OONF_LOG_DEBUG_INFO
      remember = z_node;
#endif
    }
  }

#ifdef OONF_LOG_DEBUG_INFO
  if (remember) {
    OONF_DEBUG(LOG_MPR, "minimal d_z_y(%s) = %s (cost %u)", netaddr_to_string(&nbuf1, &y->addr),
      netaddr_to_string(&nbuf2, &remember->addr), min_d_z_y);
  }
  else {
    OONF_DEBUG(LOG_MPR, "minimal d_z_y(%s) = infinite", netaddr_to_string(&nbuf1, &y->addr));
  }
#endif
  y->min_d_z_y = min_d_z_y;
  return min_d_z_y;
}